

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

void __thiscall obx::Transaction::success(Transaction *this)

{
  OBX_txn *pOVar1;
  obx_err err;
  OBX_txn *txn;
  Transaction *this_local;
  
  pOVar1 = this->cTxn_;
  if (pOVar1 != (OBX_txn *)0x0) {
    this->cTxn_ = (OBX_txn *)0x0;
    err = obx_txn_success(pOVar1);
    internal::checkErrOrThrow(err);
    return;
  }
  internal::throwIllegalStateException("State condition failed: ","txn");
}

Assistant:

void Transaction::success() {
    OBX_txn* txn = cTxn_;
    OBX_VERIFY_STATE(txn);
    cTxn_ = nullptr;
    internal::checkErrOrThrow(obx_txn_success(txn));
}